

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewdialog.cpp
# Opt level: O0

void __thiscall QPrintPreviewDialogPrivate::updateNavActions(QPrintPreviewDialogPrivate *this)

{
  int iVar1;
  long in_RDI;
  long in_FS_OFFSET;
  int numPages;
  int curPage;
  QPrintPreviewWidget *in_stack_ffffffffffffffc0;
  QString *pQVar2;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = QPrintPreviewWidget::currentPage(in_stack_ffffffffffffffc0);
  QPrintPreviewWidget::pageCount(in_stack_ffffffffffffffc0);
  QAction::setEnabled(SUB81(*(undefined8 *)(in_RDI + 0x328),0));
  QAction::setEnabled(SUB81(*(undefined8 *)(in_RDI + 0x330),0));
  QAction::setEnabled(SUB81(*(undefined8 *)(in_RDI + 0x338),0));
  QAction::setEnabled(SUB81(*(undefined8 *)(in_RDI + 0x340),0));
  pQVar2 = *(QString **)(in_RDI + 0x308);
  QString::number((int)local_20,iVar1);
  QLineEdit::setText(pQVar2);
  QString::~QString((QString *)0x17e317);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPrintPreviewDialogPrivate::updateNavActions()
{
    int curPage = preview->currentPage();
    int numPages = preview->pageCount();
    nextPageAction->setEnabled(curPage < numPages);
    prevPageAction->setEnabled(curPage > 1);
    firstPageAction->setEnabled(curPage > 1);
    lastPageAction->setEnabled(curPage < numPages);
    pageNumEdit->setText(QString::number(curPage));
}